

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall
pugi::xml_document::save_file
          (xml_document *this,char *path_,char_t *indent,uint flags,xml_encoding encoding)

{
  bool bVar1;
  char *__modes;
  auto_deleter<_IO_FILE> file;
  auto_deleter<_IO_FILE> local_30;
  
  __modes = "w";
  if ((flags & 0x20) == 0) {
    __modes = "wb";
  }
  local_30.data = (_IO_FILE *)fopen(path_,__modes);
  local_30.deleter = impl::anon_unknown_0::close_file;
  bVar1 = impl::anon_unknown_0::save_file_impl(this,local_30.data,indent,flags,encoding);
  impl::anon_unknown_0::auto_deleter<_IO_FILE>::~auto_deleter(&local_30);
  return bVar1;
}

Assistant:

PUGI__FN bool xml_document::save_file(const char* path_, const char_t* indent, unsigned int flags, xml_encoding encoding) const
	{
		using impl::auto_deleter; // MSVC7 workaround
		auto_deleter<FILE> file(fopen(path_, (flags & format_save_file_text) ? "w" : "wb"), impl::close_file);

		return impl::save_file_impl(*this, file.data, indent, flags, encoding);
	}